

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O0

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  TestError *pTVar1;
  undefined1 *local_3d8;
  string *fs;
  string *gs;
  string *tes;
  string *tcs;
  string *vs;
  string *cs;
  string local_3a0 [39];
  allocator<char> local_379;
  string local_378 [32];
  string local_358 [39];
  allocator<char> local_331;
  string local_330 [39];
  allocator<char> local_309;
  string local_308 [32];
  string local_2e8 [39];
  allocator<char> local_2c1;
  string local_2c0 [39];
  allocator<char> local_299;
  string local_298 [32];
  string local_278 [39];
  allocator<char> local_251;
  string local_250 [39];
  allocator<char> local_229;
  string local_228 [32];
  string local_208 [39];
  allocator<char> local_1e1;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  string local_198 [39];
  allocator<char> local_171;
  string local_170 [39];
  allocator<char> local_149;
  string local_148 [32];
  string local_128 [39];
  allocator<char> local_101;
  string local_100 [39];
  allocator<char> local_d9;
  string local_d8 [32];
  string local_b8 [32];
  undefined1 local_98 [8];
  string shader_source;
  string local_70 [8];
  string example_struct_end;
  allocator<char> local_39;
  string local_38 [8];
  string example_struct_begin;
  TestShaderType tested_shader_type_local;
  SizedDeclarationsTypenameStyle5<glcts::ArraysOfArrays::Interface::ES> *this_local;
  
  example_struct_begin.field_2._12_4_ = tested_shader_type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_38,"struct light {\n",&local_39);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,"};\n\n",(allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(shader_source.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_98,local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d8,"    float",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"[2]",&local_101);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_b8,this,local_d8,local_100,2);
  std::__cxx11::string::operator+=((string *)local_98,local_b8);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148," a",&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_170,"[2]",&local_171);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_128,this,local_148,local_170,0);
  std::__cxx11::string::operator+=((string *)local_98,local_128);
  std::__cxx11::string::~string(local_128);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator(&local_171);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::__cxx11::string::operator+=((string *)local_98,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"b",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"[2]",&local_1e1);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_198,this,local_1b8,local_1e0,2);
  std::__cxx11::string::operator+=((string *)local_98,local_198);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::operator+=((string *)local_98,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_228,"c",&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_250,"[2]",&local_251);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_208,this,local_228,local_250,3);
  std::__cxx11::string::operator+=((string *)local_98,local_208);
  std::__cxx11::string::~string(local_208);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator(&local_251);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator(&local_229);
  std::__cxx11::string::operator+=((string *)local_98,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"d",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"[2]",&local_2c1);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_278,this,local_298,local_2c0,4);
  std::__cxx11::string::operator+=((string *)local_98,local_278);
  std::__cxx11::string::~string(local_278);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  std::__cxx11::string::~string(local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::string::operator+=((string *)local_98,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_308,"e",&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_330,"[2]",&local_331);
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_2e8,this,local_308,local_330,5);
  std::__cxx11::string::operator+=((string *)local_98,local_2e8);
  std::__cxx11::string::~string(local_2e8);
  std::__cxx11::string::~string(local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string(local_308);
  std::allocator<char>::~allocator(&local_309);
  std::__cxx11::string::operator+=((string *)local_98,", ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_378,"f",&local_379);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_3a0,"[2]",(allocator<char> *)((long)&cs + 7));
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[6])(local_358,this,local_378,local_3a0,6);
  std::__cxx11::string::operator+=((string *)local_98,local_358);
  std::__cxx11::string::~string(local_358);
  std::__cxx11::string::~string(local_3a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cs + 7));
  std::__cxx11::string::~string(local_378);
  std::allocator<char>::~allocator(&local_379);
  std::__cxx11::string::operator+=((string *)local_98,";\n");
  std::__cxx11::string::operator+=((string *)local_98,local_70);
  std::__cxx11::string::operator+=((string *)local_98,(string *)shader_start_abi_cxx11_);
  switch(example_struct_begin.field_2._12_4_) {
  case 0:
    break;
  case 1:
    std::__cxx11::string::operator+=((string *)local_98,"\n\tgl_Position = vec4(0.0);\n");
    break;
  case 2:
    break;
  case 3:
    std::__cxx11::string::operator+=((string *)local_98,(string *)emit_quad_abi_cxx11_);
    break;
  case 4:
    std::__cxx11::string::operator+=((string *)local_98,(string *)set_tesseation_abi_cxx11_);
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Unrecognized shader type.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x66f);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::operator+=((string *)local_98,(string *)shader_end_abi_cxx11_);
  tcs = (string *)default_vertex_shader_source_abi_cxx11_;
  local_3d8 = default_fragment_shader_source_abi_cxx11_;
  switch(example_struct_begin.field_2._12_4_) {
  case 0:
    local_3d8 = local_98;
    break;
  case 1:
    tcs = (string *)local_98;
    break;
  case 2:
    tcs = (string *)empty_string_abi_cxx11_;
    local_3d8 = empty_string_abi_cxx11_;
    break;
  case 3:
    break;
  case 4:
    break;
  case 5:
    break;
  default:
    pTVar1 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar1,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
               ,0x672);
    __cxa_throw(pTVar1,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (*(this->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.super_TestNode.
    _vptr_TestNode[9])(this,tcs,local_3d8,1,0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SizedDeclarationsTypenameStyle5<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	std::string example_struct_begin("struct light {\n");
	std::string example_struct_end("};\n\n");

	std::string shader_source = example_struct_begin;

	shader_source += this->extend_string("    float", "[2]", 2);
	shader_source += this->extend_string(" a", "[2]", API::MAX_ARRAY_DIMENSIONS - API::MAX_ARRAY_DIMENSIONS);
	shader_source += ", ";
	shader_source += this->extend_string("b", "[2]", 2);
	shader_source += ", ";
	shader_source += this->extend_string("c", "[2]", 3);
	shader_source += ", ";
	shader_source += this->extend_string("d", "[2]", 4);
	shader_source += ", ";
	shader_source += this->extend_string("e", "[2]", 5);
	shader_source += ", ";
	shader_source += this->extend_string("f", "[2]", 6);
	shader_source += ";\n";
	shader_source += example_struct_end;
	shader_source += shader_start;

	/* End main */
	DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

	/* Execute test */
	EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);
}